

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O0

void parse_tcp(packet_t *pkt)

{
  uint uVar1;
  int iVar2;
  double in_XMM0_Qa;
  int thl;
  packet_t *pkt_local;
  
  if (pkt->payload < 0x14) {
    in_XMM0_Qa = _log(in_XMM0_Qa);
  }
  pkt->tcp = (tcp_t *)(pkt->data + pkt->offset);
  uVar1 = (uint)((byte)pkt->tcp->field_0xc >> 4);
  iVar2 = uVar1 * 4;
  if (pkt->payload < iVar2) {
    _log(in_XMM0_Qa);
  }
  else {
    pkt->offset = iVar2 + pkt->offset;
    pkt->payload = pkt->payload + uVar1 * -4;
  }
  return;
}

Assistant:

static int parse_tcp(void *data, char **str, int inv)
{
	match_tcp_t *m = (match_tcp_t *)data;
	int inv_type = 0;
	char *p = *str;
	char *q = p;
	char *r = NULL;
	q = strtok(NULL, " \t\n");

	if (q == NULL) {
		log_err("opt \"%s\" arg is null", p);
		goto err;
	}

	if (strcmp(p, "--sport") == 0) {
		if (parse_port(q, m->src) != 0) {
			goto err;
		}

		inv_type = INV_TCP_SRC;
	} else if (strcmp(p, "--dport") == 0) {
		if (parse_port(q, m->dst) != 0) {
			goto err;
		}

		inv_type = INV_TCP_DST;
	} else if (strcmp(p, "--tcp-flags") == 0) {
		r = strtok(NULL, " \t\n");

		if (r == NULL) {
			log_err("opt --tcp-flags requires two args\n");
			goto err;
		}

		m->flag = parse_tcp_flag(r);
		m->flag_mask = parse_tcp_flag(q);
		q = r;
		inv_type = INV_TCP_FLAG;
	} else if (strcmp(p, "--tcp-option") == 0) {
		//TODO:
	}

	if (inv && inv_type) {
		m->invert |= inv_type;
	}

	p = q;
	return 0;
err:
	return -1;
}